

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::moveRowsFromBranchToRoot(tst_GenericModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ModelTest *this_00;
  int i;
  undefined1 local_120 [24];
  QArrayDataPointer<char16_t> local_108;
  anon_union_24_3_e3d07ef4_for_data local_e8;
  QArrayDataPointer<char16_t> local_c8;
  GenericModel testModel;
  QModelIndex local_90;
  QArrayDataPointer<char16_t> local_78;
  uint local_5c;
  QModelIndex parIndex;
  ModelTest probe;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  this_00 = &probe;
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  local_e8._forAlignment = -NAN;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  fillTable((tst_GenericModel *)this_00,(QAbstractItemModel *)&testModel,5,3,
            (QModelIndex *)&local_e8,0);
  local_e8._forAlignment = -NAN;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  GenericModel::index((int)&parIndex,(int)&testModel,(QModelIndex *)0x1);
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x4);
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x5);
  uVar6 = 0;
  while (iVar3 = GenericModel::rowCount((QModelIndex *)&testModel), (int)uVar6 < iVar3) {
    local_5c = uVar6;
    for (iVar3 = 0; iVar4 = GenericModel::columnCount((QModelIndex *)&testModel), uVar6 = local_5c,
        iVar3 < iVar4; iVar3 = iVar3 + 1) {
      GenericModel::index((int)local_120,(int)&testModel,(QModelIndex *)(ulong)local_5c);
      local_108.d = (Data *)0x0;
      local_108.ptr = L"r%1,c%2";
      local_108.size = 7;
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (char16_t *)0x0;
      local_c8.size = 0;
      QString::arg((QString *)&local_78,(QString *)&local_108,uVar6,0,10,(QChar)0x20);
      QString::arg((QString *)&local_90,(QString *)&local_78,iVar3,0,10,(QChar)0x20);
      QVariant::QVariant((QVariant *)&local_e8,(QString *)&local_90);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)local_120,(int)&local_e8);
      QVariant::~QVariant((QVariant *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    }
    uVar6 = local_5c + 1;
  }
  local_e8._forAlignment = -NAN;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  bVar1 = (bool)GenericModel::moveRows
                          ((QModelIndex *)&testModel,(int)&parIndex,1,(QModelIndex *)0x2,
                           (int)&local_e8);
  cVar2 = QTest::qVerify(bVar1,"testModel.moveRows(parIndex, 1, 2, QModelIndex(), 0)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x7c3);
  if (cVar2 != '\0') {
    iVar3 = GenericModel::rowCount((QModelIndex *)&testModel);
    cVar2 = QTest::qCompare(iVar3,3,"testModel.rowCount(parIndex)","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7c4);
    if (cVar2 != '\0') {
      iVar3 = GenericModel::columnCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar3,4,"testModel.columnCount(parIndex)","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7c5);
      if (cVar2 != '\0') {
        local_e8._forAlignment = -NAN;
        local_e8._8_8_ = 0;
        local_e8._16_8_ = 0;
        iVar3 = GenericModel::rowCount((QModelIndex *)&testModel);
        cVar2 = QTest::qCompare(iVar3,7,"testModel.rowCount()","7",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x7c6);
        if (cVar2 != '\0') {
          local_e8._forAlignment = -NAN;
          local_e8._8_8_ = 0;
          local_e8._16_8_ = 0;
          iVar3 = GenericModel::columnCount((QModelIndex *)&testModel);
          cVar2 = QTest::qCompare(iVar3,4,"testModel.columnCount()","4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x7c7);
          if (cVar2 != '\0') {
            local_78.d = (Data *)0xffffffffffffffff;
            local_78.ptr = (char16_t *)0x0;
            local_78.size = 0;
            GenericModel::index((int)&local_90,(int)&testModel,(QModelIndex *)0x0);
            QModelIndex::data((QVariant *)&local_e8,&local_90,0);
            QVariant::toString();
            local_108.d = (Data *)0x0;
            local_108.ptr = L"r1,c0";
            local_108.size = 5;
            local_c8.d = (Data *)0x0;
            local_c8.ptr = (char16_t *)0x0;
            local_c8.size = 0;
            bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_108,
                                    "testModel.index(0, 0).data().toString()",
                                    "QStringLiteral(\"r1,c0\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x7c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_120);
            QVariant::~QVariant((QVariant *)&local_e8);
            if (bVar1) {
              local_78.d = (Data *)0xffffffffffffffff;
              local_78.ptr = (char16_t *)0x0;
              local_78.size = 0;
              GenericModel::index((int)&local_90,(int)&testModel,(QModelIndex *)0x1);
              QModelIndex::data((QVariant *)&local_e8,&local_90,0);
              QVariant::toString();
              local_108.d = (Data *)0x0;
              local_108.ptr = L"r2,c0";
              local_108.size = 5;
              local_c8.d = (Data *)0x0;
              local_c8.ptr = (char16_t *)0x0;
              local_c8.size = 0;
              bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_108,
                                      "testModel.index(1, 0).data().toString()",
                                      "QStringLiteral(\"r2,c0\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x7c9);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_120);
              QVariant::~QVariant((QVariant *)&local_e8);
              if (bVar1) {
                local_78.d = (Data *)0xffffffffffffffff;
                local_78.ptr = (char16_t *)0x0;
                local_78.size = 0;
                GenericModel::index((int)&local_90,(int)&testModel,(QModelIndex *)0x0);
                QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                QVariant::toString();
                local_108.d = (Data *)0x0;
                local_108.ptr = L"r1,c3";
                local_108.size = 5;
                local_c8.d = (Data *)0x0;
                local_c8.ptr = (char16_t *)0x0;
                local_c8.size = 0;
                bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_108,
                                        "testModel.index(0, 3).data().toString()",
                                        "QStringLiteral(\"r1,c3\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x7ca);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_120);
                QVariant::~QVariant((QVariant *)&local_e8);
                if (bVar1) {
                  local_78.d = (Data *)0xffffffffffffffff;
                  local_78.ptr = (char16_t *)0x0;
                  local_78.size = 0;
                  GenericModel::index((int)&local_90,(int)&testModel,(QModelIndex *)0x1);
                  QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                  QVariant::toString();
                  local_108.d = (Data *)0x0;
                  local_108.ptr = L"r2,c3";
                  local_108.size = 5;
                  local_c8.d = (Data *)0x0;
                  local_c8.ptr = (char16_t *)0x0;
                  local_c8.size = 0;
                  bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_108,
                                          "testModel.index(1, 3).data().toString()",
                                          "QStringLiteral(\"r2,c3\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x7cb);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_120);
                  QVariant::~QVariant((QVariant *)&local_e8);
                  if (bVar1) {
                    local_78.d = (Data *)0xffffffffffffffff;
                    local_78.ptr = (char16_t *)0x0;
                    local_78.size = 0;
                    GenericModel::index((int)&local_90,(int)&testModel,(QModelIndex *)0x2);
                    QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                    QVariant::toString();
                    local_108.d = (Data *)0x0;
                    local_108.ptr = L"0,0";
                    local_108.size = 3;
                    local_c8.d = (Data *)0x0;
                    local_c8.ptr = (char16_t *)0x0;
                    local_c8.size = 0;
                    bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_108,
                                            "testModel.index(2, 0).data().toString()",
                                            "QStringLiteral(\"0,0\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x7cc);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_120);
                    QVariant::~QVariant((QVariant *)&local_e8);
                    if (bVar1) {
                      local_78.d = (Data *)0xffffffffffffffff;
                      local_78.ptr = (char16_t *)0x0;
                      local_78.size = 0;
                      GenericModel::index((int)&local_90,(int)&testModel,(QModelIndex *)0x3);
                      QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                      QVariant::toString();
                      local_108.d = (Data *)0x0;
                      local_108.ptr = L"1,0";
                      local_108.size = 3;
                      local_c8.d = (Data *)0x0;
                      local_c8.ptr = (char16_t *)0x0;
                      local_c8.size = 0;
                      bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_108,
                                              "testModel.index(3, 0).data().toString()",
                                              "QStringLiteral(\"1,0\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x7cd);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)local_120);
                      QVariant::~QVariant((QVariant *)&local_e8);
                      if (bVar1) {
                        local_78.d = (Data *)0xffffffffffffffff;
                        local_78.ptr = (char16_t *)0x0;
                        local_78.size = 0;
                        GenericModel::index((int)&local_90,(int)&testModel,(QModelIndex *)0x4);
                        QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                        QVariant::toString();
                        local_108.d = (Data *)0x0;
                        local_108.ptr = L"2,0";
                        local_108.size = 3;
                        local_c8.d = (Data *)0x0;
                        local_c8.ptr = (char16_t *)0x0;
                        local_c8.size = 0;
                        bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_108,
                                                "testModel.index(4, 0).data().toString()",
                                                "QStringLiteral(\"2,0\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x7ce);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)local_120);
                        QVariant::~QVariant((QVariant *)&local_e8);
                        if (bVar1) {
                          local_78.d = (Data *)0xffffffffffffffff;
                          local_78.ptr = (char16_t *)0x0;
                          local_78.size = 0;
                          iVar3 = 5;
                          GenericModel::index((int)&local_90,(int)&testModel,(QModelIndex *)0x5);
                          QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                          QVariant::toString();
                          local_108.d = (Data *)0x0;
                          local_108.ptr = L"3,0";
                          local_108.size = 3;
                          local_c8.d = (Data *)0x0;
                          local_c8.ptr = (char16_t *)0x0;
                          local_c8.size = 0;
                          bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_108,
                                                  "testModel.index(5, 0).data().toString()",
                                                  "QStringLiteral(\"3,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,1999);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                    ((QArrayDataPointer<char16_t> *)local_120);
                          QVariant::~QVariant((QVariant *)&local_e8);
                          if (bVar1) {
                            local_78.d = (Data *)0xffffffffffffffff;
                            local_78.ptr = (char16_t *)0x0;
                            local_78.size = 0;
                            GenericModel::index((int)&local_90,(int)&testModel,(QModelIndex *)0x6);
                            QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                            QVariant::toString();
                            local_108.d = (Data *)0x0;
                            local_108.ptr = L"4,0";
                            local_108.size = 3;
                            local_c8.d = (Data *)0x0;
                            local_c8.ptr = (char16_t *)0x0;
                            local_c8.size = 0;
                            bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_108,
                                                    "testModel.index(6, 0).data().toString()",
                                                    "QStringLiteral(\"4,0\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,2000);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer
                                      ((QArrayDataPointer<char16_t> *)local_120);
                            QVariant::~QVariant((QVariant *)&local_e8);
                            if (bVar1) {
                              iVar4 = 2;
                              do {
                                bVar1 = iVar3 == 0;
                                iVar3 = iVar3 + -1;
                                if (bVar1) {
                                  GenericModel::index((int)&local_90,(int)&testModel,
                                                      (QModelIndex *)0x0);
                                  QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                                  QVariant::toString();
                                  local_78.d = (Data *)0x0;
                                  local_78.ptr = L"r0,c0";
                                  local_78.size = 5;
                                  local_108.d = (Data *)0x0;
                                  local_108.ptr = (char16_t *)0x0;
                                  local_108.size = 0;
                                  bVar1 = QTest::qCompare((QString *)local_120,(QString *)&local_78,
                                                                                                                    
                                                  "testModel.index(0, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"r0,c0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d3);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                            ((QArrayDataPointer<char16_t> *)local_120);
                                  QVariant::~QVariant((QVariant *)&local_e8);
                                  if (bVar1) {
                                    GenericModel::index((int)&local_90,(int)&testModel,
                                                        (QModelIndex *)0x1);
                                    QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                                    QVariant::toString();
                                    local_78.d = (Data *)0x0;
                                    local_78.ptr = L"r3,c0";
                                    local_78.size = 5;
                                    local_108.d = (Data *)0x0;
                                    local_108.ptr = (char16_t *)0x0;
                                    local_108.size = 0;
                                    bVar1 = QTest::qCompare((QString *)local_120,
                                                            (QString *)&local_78,
                                                                                                                        
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"r3,c0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d4);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                                              ((QArrayDataPointer<char16_t> *)local_120);
                                    QVariant::~QVariant((QVariant *)&local_e8);
                                    if (bVar1) {
                                      GenericModel::index((int)&local_90,(int)&testModel,
                                                          (QModelIndex *)0x2);
                                      QModelIndex::data((QVariant *)&local_e8,&local_90,0);
                                      QVariant::toString();
                                      local_78.d = (Data *)0x0;
                                      local_78.ptr = L"r4,c0";
                                      local_78.size = 5;
                                      local_108.d = (Data *)0x0;
                                      local_108.ptr = (char16_t *)0x0;
                                      local_108.size = 0;
                                      QTest::qCompare((QString *)local_120,(QString *)&local_78,
                                                                                                            
                                                  "testModel.index(2, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"r4,c0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d5);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                ((QArrayDataPointer<char16_t> *)local_120);
                                      QVariant::~QVariant((QVariant *)&local_e8);
                                    }
                                  }
                                  break;
                                }
                                GenericModel::headerData
                                          ((int)&local_e8,(Orientation)&testModel,iVar4);
                                iVar5 = QVariant::toInt((bool *)local_e8.data);
                                cVar2 = QTest::qCompare(iVar5,iVar4 + -2,
                                                                                                                
                                                  "testModel.headerData(i, Qt::Vertical).toInt()",
                                                  "i - 2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7d2);
                                QVariant::~QVariant((QVariant *)&local_e8);
                                iVar4 = iVar4 + 1;
                              } while (cVar2 != '\0');
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveRowsFromBranchToRoot()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 5, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    testModel.insertColumns(0, 4, parIndex);
    testModel.insertRows(0, 5, parIndex);
    for (int r = 0; r < testModel.rowCount(parIndex); ++r) {
        for (int c = 0; c < testModel.columnCount(parIndex); ++c)
            testModel.setData(testModel.index(r, c, parIndex), QStringLiteral("r%1,c%2").arg(r).arg(c));
    }

    QVERIFY(testModel.moveRows(parIndex, 1, 2, QModelIndex(), 0));
    QCOMPARE(testModel.rowCount(parIndex), 3);
    QCOMPARE(testModel.columnCount(parIndex), 4);
    QCOMPARE(testModel.rowCount(), 7);
    QCOMPARE(testModel.columnCount(), 4);
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("r1,c0"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("r2,c0"));
    QCOMPARE(testModel.index(0, 3).data().toString(), QStringLiteral("r1,c3"));
    QCOMPARE(testModel.index(1, 3).data().toString(), QStringLiteral("r2,c3"));
    QCOMPARE(testModel.index(2, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(3, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(4, 0).data().toString(), QStringLiteral("2,0"));
    QCOMPARE(testModel.index(5, 0).data().toString(), QStringLiteral("3,0"));
    QCOMPARE(testModel.index(6, 0).data().toString(), QStringLiteral("4,0"));
    for (int i = 2; i < 7; ++i)
        QCOMPARE(testModel.headerData(i, Qt::Vertical).toInt(), i - 2);
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("r0,c0"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("r3,c0"));
    QCOMPARE(testModel.index(2, 0, parIndex).data().toString(), QStringLiteral("r4,c0"));
}